

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::ConsoleReporter::AssertionPrinter::printReconstructedExpression(AssertionPrinter *this)

{
  ostream *_stream;
  bool bVar1;
  string *this_00;
  string sStack_a8;
  Text local_88;
  TextAttributes local_30;
  
  this_00 = &sStack_a8;
  bVar1 = AssertionResult::hasExpandedExpression(this->result);
  if (bVar1) {
    std::operator<<(this->stream,"with expansion:\n");
    (**(code **)(*Colour::impl + 0x10))(Colour::impl,6);
    _stream = this->stream;
    std::__cxx11::string::string((string *)&sStack_a8,(string *)&this->result->m_resultData);
    local_30.initialIndent = 0xffffffffffffffff;
    local_30.width = 0x4f;
    local_30.tabChar = '\t';
    local_30.indent = 2;
    Text::Text(&local_88,&sStack_a8,&local_30);
    operator<<(_stream,&local_88);
    std::operator<<(_stream,"\n");
    Text::~Text(&local_88);
    std::__cxx11::string::~string((string *)&sStack_a8);
    Colour::~Colour((Colour *)this_00);
  }
  return;
}

Assistant:

void printReconstructedExpression() const {
                if( result.hasExpandedExpression() ) {
                    stream << "with expansion:\n";
                    Colour colourGuard( Colour::ReconstructedExpression );
                    stream << Text( result.getExpandedExpression(), TextAttributes().setIndent(2) ) << "\n";
                }
            }